

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

mpc_parser_t * mpc_and(int n,mpc_fold_t f,...)

{
  char in_AL;
  void *pvVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_128;
  undefined8 *local_110;
  undefined8 local_f8 [4];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  mpc_parser_t *local_40;
  mpc_parser_t *p;
  va_list va;
  int i;
  mpc_fold_t f_local;
  int n_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_f8[2] = in_RDX;
  local_f8[3] = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_40 = mpc_undefined();
  local_40->type = '\x18';
  (local_40->data).repeat.n = n;
  (local_40->data).repeat.f = f;
  pvVar1 = malloc((long)n << 3);
  (local_40->data).apply_to.d = pvVar1;
  pvVar1 = malloc((long)(n + -1) << 3);
  (local_40->data).check_with.d = pvVar1;
  va[0]._0_8_ = &stack0x00000008;
  p._0_4_ = 0x10;
  for (va[0].reg_save_area._4_4_ = 0; va[0].reg_save_area._4_4_ < n;
      va[0].reg_save_area._4_4_ = va[0].reg_save_area._4_4_ + 1) {
    if ((uint)p < 0x29) {
      local_110 = (undefined8 *)((long)local_f8 + (long)(int)(uint)p);
      p._0_4_ = (uint)p + 8;
    }
    else {
      local_110 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    *(undefined8 *)((long)(local_40->data).apply_to.d + (long)va[0].reg_save_area._4_4_ * 8) =
         *local_110;
  }
  for (va[0].reg_save_area._4_4_ = 0; va[0].reg_save_area._4_4_ < n + -1;
      va[0].reg_save_area._4_4_ = va[0].reg_save_area._4_4_ + 1) {
    if ((uint)p < 0x29) {
      local_128 = (undefined8 *)((long)local_f8 + (long)(int)(uint)p);
      p._0_4_ = (uint)p + 8;
    }
    else {
      local_128 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    *(undefined8 *)((local_40->data).check.e + (long)va[0].reg_save_area._4_4_ * 8) = *local_128;
  }
  return local_40;
}

Assistant:

mpc_parser_t *mpc_and(int n, mpc_fold_t f, ...) {

  int i;
  va_list va;

  mpc_parser_t *p = mpc_undefined();

  p->type = MPC_TYPE_AND;
  p->data.and.n = n;
  p->data.and.f = f;
  p->data.and.xs = malloc(sizeof(mpc_parser_t*) * n);
  p->data.and.dxs = malloc(sizeof(mpc_dtor_t) * (n-1));

  va_start(va, f);
  for (i = 0; i < n; i++) {
    p->data.and.xs[i] = va_arg(va, mpc_parser_t*);
  }
  for (i = 0; i < (n-1); i++) {
    p->data.and.dxs[i] = va_arg(va, mpc_dtor_t);
  }
  va_end(va);

  return p;
}